

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
server_response::add_waiting_tasks
          (server_response *this,vector<server_task,_std::allocator<server_task>_> *tasks)

{
  pointer psVar1;
  common_log *log;
  server_task *task;
  pointer psVar2;
  __hashtable *__h;
  unique_lock<std::mutex> lock;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex_results;
  local_40._M_owns = false;
  httplib::detail::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  psVar2 = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      if (0 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                       "srv  %12.*s: add task %d to waiting list. current waiting = %d (before add)\n"
                       ,0xc,"add_waiting_tasks",(ulong)(uint)psVar2->id,
                       (int)(this->waiting_task_ids)._M_h._M_element_count);
      }
      local_48 = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->waiting_task_ids;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->waiting_task_ids,psVar2,&local_48);
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void add_waiting_tasks(const std::vector<server_task> & tasks) {
        std::unique_lock<std::mutex> lock(mutex_results);

        for (const auto & task : tasks) {
            SRV_DBG("add task %d to waiting list. current waiting = %d (before add)\n", task.id, (int) waiting_task_ids.size());
            waiting_task_ids.insert(task.id);
        }
    }